

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O2

int Wildcard::wildcardfit(char *wildcard,char *test)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  char *test_local;
  char *local_20;
  
  uVar2 = 1;
  test_local = test;
  local_20 = wildcard;
  while( true ) {
    bVar3 = uVar2 == 1;
    if ((!bVar3) || (cVar1 = *local_20, cVar1 == '\0')) goto LAB_00230354;
    if (*test_local == '\0') break;
    if (cVar1 == '*') {
      uVar2 = asterisk(&local_20,&test_local);
      local_20 = local_20 + -1;
    }
    else if (cVar1 == '?') {
      test_local = test_local + 1;
      uVar2 = 1;
    }
    else if (cVar1 == '[') {
      local_20 = local_20 + 1;
      uVar2 = set(&local_20,&test_local);
    }
    else {
      uVar2 = (uint)(cVar1 == *test_local);
      test_local = test_local + 1;
    }
    local_20 = local_20 + 1;
  }
  bVar3 = true;
LAB_00230354:
  do {
    cVar1 = *local_20;
    local_20 = local_20 + 1;
  } while ((bool)(bVar3 & cVar1 == '*'));
  uVar2 = 0;
  if ((bVar3) && (*test_local == '\0')) {
    uVar2 = (uint)(cVar1 == '\0');
  }
  return uVar2;
}

Assistant:

int Wildcard::wildcardfit(const char* wildcard, const char* test) {
  int fit = 1;

  for (; ('\000' != *wildcard) && (1 == fit) && ('\000' != *test); wildcard++) {
    switch (*wildcard) {
    case '[':
      wildcard++; /* leave out the opening square bracket */
      fit = set(&wildcard, &test);
      /* we don't need to decrement the wildcard as in case */
      /* of asterisk because the closing ] is still there */
      break;
    case '?':
      test++;
      break;
    case '*':
      fit = asterisk(&wildcard, &test);
      /* the asterisk was skipped by asterisk() but the loop will */
      /* increment by itself. So we have to decrement */
      wildcard--;
      break;
    default:
      fit = (int)(*wildcard == *test);
      test++;
    }
  }
  while ((*wildcard == '*') && (1 == fit))
    /* here the teststring is empty otherwise you cannot */
    /* leave the previous loop */
    wildcard++;
  return (int)((1 == fit) && ('\0' == *test) && ('\0' == *wildcard));
}